

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O2

void __thiscall
OperandEquation::operandOrder
          (OperandEquation *this,Constructor *ct,
          vector<OperandSymbol_*,_std::allocator<OperandSymbol_*>_> *order)

{
  OperandSymbol *sym;
  OperandSymbol *local_10;
  
  local_10 = (ct->operands).super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>.
             _M_impl.super__Vector_impl_data._M_start[this->index];
  if ((local_10->flags & 8) == 0) {
    std::vector<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>::push_back(order,&local_10);
    local_10->flags = local_10->flags | 8;
  }
  return;
}

Assistant:

void OperandEquation::operandOrder(Constructor *ct,vector<OperandSymbol *> &order) const

{
  OperandSymbol *sym = ct->getOperand(index);
  if (!sym->isMarked()) {
    order.push_back(sym);
    sym->setMark();
  }
}